

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O3

void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *p,int iGrp1,int iGrp2)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  char **ppcVar4;
  char cVar5;
  
  if ((iGrp1 < 1) || (iVar2 = p->nCols + -1, iVar2 <= iGrp1)) {
    __assert_fail("iGrp1 >= 1 && iGrp1 < p->nCols - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                  ,0xe3,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  if ((iGrp2 < 1) || (iVar2 <= iGrp2)) {
    __assert_fail("iGrp2 >= 1 && iGrp2 < p->nCols - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                  ,0xe4,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  if (p->pColGrps[(uint)iGrp1] == (Llb_Grp_t *)0x0) {
    __assert_fail("p->pColGrps[iGrp1] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                  ,0xe5,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  if (p->pColGrps[(uint)iGrp2] == (Llb_Grp_t *)0x0) {
    __assert_fail("p->pColGrps[iGrp2] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                  ,0xe6,"void Llb_MtrCombineSelectedColumns(Llb_Mtr_t *, int, int)");
  }
  if (0 < p->nRows) {
    lVar3 = 0;
    do {
      ppcVar4 = p->pMatrix;
      pcVar1 = ppcVar4[(uint)iGrp1];
      cVar5 = pcVar1[lVar3];
      if (cVar5 == '\x01') {
        if (ppcVar4[(uint)iGrp2][lVar3] == '\x01') {
          p->pRowSums[lVar3] = p->pRowSums[lVar3] + -1;
          cVar5 = pcVar1[lVar3];
          goto LAB_0092f52d;
        }
      }
      else {
LAB_0092f52d:
        if ((cVar5 == '\0') && (ppcVar4[(uint)iGrp2][lVar3] == '\x01')) {
          pcVar1[lVar3] = '\x01';
          p->pColSums[(uint)iGrp1] = p->pColSums[(uint)iGrp1] + 1;
          ppcVar4 = p->pMatrix;
        }
      }
      if (ppcVar4[(uint)iGrp2][lVar3] == '\x01') {
        ppcVar4[(uint)iGrp2][lVar3] = '\0';
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nRows);
  }
  p->pColSums[(uint)iGrp2] = 0;
  return;
}

Assistant:

void Llb_MtrCombineSelectedColumns( Llb_Mtr_t * p, int iGrp1, int iGrp2 )
{
    int iVar;
    assert( iGrp1 >= 1 && iGrp1 < p->nCols - 1 );
    assert( iGrp2 >= 1 && iGrp2 < p->nCols - 1 );
    assert( p->pColGrps[iGrp1] != NULL );
    assert( p->pColGrps[iGrp2] != NULL );
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pMatrix[iGrp1][iVar] == 1 && p->pMatrix[iGrp2][iVar] == 1 )
            p->pRowSums[iVar]--;
        if ( p->pMatrix[iGrp1][iVar] == 0 && p->pMatrix[iGrp2][iVar] == 1 )
        {
            p->pMatrix[iGrp1][iVar] = 1;
            p->pColSums[iGrp1]++;
        }
        if ( p->pMatrix[iGrp2][iVar] == 1 )
            p->pMatrix[iGrp2][iVar] = 0;
    }
    p->pColSums[iGrp2] = 0;
}